

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeom_utility.h
# Opt level: O1

int ProjectInParametricDomain<pzgeom::TPZEllipse3D>(TPZVec<double> *qsi,TPZVec<double> *qsiInDomain)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int sideto;
  double dVar5;
  double dVar6;
  TPZManVector<double,_3> pt2;
  TPZManVector<double,_3> pt1;
  TPZTransform<double> T2;
  TPZTransform<double> T1;
  double local_3f0;
  TPZManVector<double,_3> local_3e0;
  TPZManVector<double,_3> local_3a8;
  TPZTransform<double> local_370;
  TPZTransform<double> local_1d0;
  
  bVar1 = pztopology::TPZLine::IsInParametricDomain(qsi,0.0);
  if (bVar1) {
    TPZVec<double>::operator=(qsiInDomain,qsi);
    iVar3 = 2;
  }
  else {
    TPZManVector<double,_3>::TPZManVector(&local_3a8,qsi->fNElements);
    TPZManVector<double,_3>::TPZManVector(&local_3e0,qsi->fNElements);
    iVar3 = -1;
    local_3f0 = 1000000000000.0;
    sideto = 0;
    do {
      pztopology::TPZLine::SideToSideTransform(&local_1d0,2,sideto);
      iVar2 = pztopology::TPZLine::SideDimension(sideto);
      TPZManVector<double,_3>::Resize(&local_3a8,(long)iVar2);
      TPZTransform<double>::Apply(&local_1d0,qsi,&local_3a8.super_TPZVec<double>);
      bVar1 = IsInSideParametricDomain<pzgeom::TPZEllipse3D>
                        (sideto,&local_3a8.super_TPZVec<double>,0.0);
      if (bVar1) {
        pztopology::TPZLine::SideToSideTransform(&local_370,sideto,2);
        TPZTransform<double>::Apply
                  (&local_370,&local_3a8.super_TPZVec<double>,&local_3e0.super_TPZVec<double>);
        if (qsi->fNElements < 1) {
          dVar5 = 0.0;
        }
        else {
          dVar5 = 0.0;
          lVar4 = 0;
          do {
            dVar6 = qsi->fStore[lVar4] - local_3e0.super_TPZVec<double>.fStore[lVar4];
            dVar5 = dVar5 + dVar6 * dVar6;
            lVar4 = lVar4 + 1;
          } while (qsi->fNElements != lVar4);
        }
        if (dVar5 < 0.0) {
          dVar5 = sqrt(dVar5);
        }
        else {
          dVar5 = SQRT(dVar5);
        }
        if (dVar5 < local_3f0) {
          TPZVec<double>::operator=(qsiInDomain,&local_3e0.super_TPZVec<double>);
          local_3f0 = dVar5;
          iVar3 = sideto;
        }
        TPZTransform<double>::~TPZTransform(&local_370);
      }
      TPZTransform<double>::~TPZTransform(&local_1d0);
      bVar1 = sideto == 0;
      sideto = sideto + 1;
    } while (bVar1);
    TPZManVector<double,_3>::~TPZManVector(&local_3e0);
    TPZManVector<double,_3>::~TPZManVector(&local_3a8);
  }
  return iVar3;
}

Assistant:

int ProjectInParametricDomain(TPZVec<REAL> &qsi, TPZVec<REAL> &qsiInDomain){
    const int nsides = Topology::NSides;
    if(Topology::IsInParametricDomain(qsi,0.)){///it is already in the domain
        qsiInDomain = qsi;
        return nsides-1;
    }//if
    
    int winnerSide = -1;
    REAL winnerDistance = 1e12;
    TPZManVector<REAL,3> pt1(qsi.NElements()), pt2(qsi.NElements());
    for(int is = 0; is < nsides-1; is++){
        
        ///Go from NSides-1 to side is
        TPZTransform<> T1 = Topology::SideToSideTransform(nsides-1, is);
        pt1.Resize(Topology::SideDimension(is));
        T1.Apply(qsi,pt1);
        
        ///Check if the point is within side boundaries
        bool IsInSideDomain = IsInSideParametricDomain<Topology>(is,pt1,0.);
        if(!IsInSideDomain) continue;
        
        ///Come back from side is to \f$ NSides-1 \f$
        TPZTransform<> T2 = Topology::SideToSideTransform(is,nsides-1);
        T2.Apply(pt1,pt2);
        
        ///Compare original to mapped point
        REAL distance = 0.;
        for(int i = 0; i < qsi.NElements(); i++){
            REAL val = qsi[i]-pt2[i];
            distance += val*val;
        }//i
        distance = sqrt(distance);
        
        ///The closest side point to the original is the projected point
        if(distance < winnerDistance){
            winnerDistance = distance;
            winnerSide = is;
            qsiInDomain = pt2;
        }
    }//for is
    
    return winnerSide;
    
}